

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cross_correlation.c
# Opt level: O1

void WebRtcSpl_CrossCorrelationC
               (int32_t *cross_correlation,int16_t *seq1,int16_t *seq2,size_t dim_seq,
               size_t dim_cross_correlation,int right_shifts,int step_seq2)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  
  if (dim_cross_correlation != 0) {
    sVar2 = 0;
    do {
      iVar1 = 0;
      if (dim_seq != 0) {
        iVar1 = 0;
        sVar3 = 0;
        do {
          iVar1 = iVar1 + ((int)seq2[sVar3] * (int)seq1[sVar3] >> ((byte)right_shifts & 0x1f));
          sVar3 = sVar3 + 1;
        } while (dim_seq != sVar3);
      }
      *cross_correlation = iVar1;
      cross_correlation = cross_correlation + 1;
      sVar2 = sVar2 + 1;
      seq2 = seq2 + step_seq2;
    } while (sVar2 != dim_cross_correlation);
  }
  return;
}

Assistant:

void WebRtcSpl_CrossCorrelationC(int32_t* cross_correlation,
                                 const int16_t* seq1,
                                 const int16_t* seq2,
                                 size_t dim_seq,
                                 size_t dim_cross_correlation,
                                 int right_shifts,
                                 int step_seq2) {
  size_t i = 0, j = 0;

  for (i = 0; i < dim_cross_correlation; i++) {
    int32_t corr = 0;
    for (j = 0; j < dim_seq; j++)
      corr += (seq1[j] * seq2[j]) >> right_shifts;
    seq2 += step_seq2;
    *cross_correlation++ = corr;
  }
}